

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifticdf.c
# Opt level: O2

double bup(double *a,double *b,double *x,double *y,int *n,double *eps)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  dVar6 = *a;
  bup::apb = *b + dVar6;
  bup::ap1 = dVar6 + 1.0;
  bup::mu = 0;
  bup::d = 1.0;
  if (((*n != 1) && (1.0 <= dVar6)) && (bup::ap1 * 1.1 <= bup::apb)) {
    dVar6 = exparg(&bup::K1);
    bup::mu = (int)ABS(dVar6);
    dVar6 = exparg(&bup::K2);
    if ((int)dVar6 < bup::mu) {
      bup::mu = (int)dVar6;
    }
    bup::d = exp(-(double)bup::mu);
  }
  dVar6 = brcmp1(&bup::mu,a,b,x,y);
  dVar6 = dVar6 / *a;
  if (*n == 1) {
    return dVar6;
  }
  if ((dVar6 == 0.0) && (!NAN(dVar6))) {
    return dVar6;
  }
  iVar1 = *n + -1;
  dVar7 = bup::d;
  if (*b <= 1.0) {
LAB_0010674b:
    iVar2 = 0;
  }
  else {
    iVar2 = iVar1;
    if (0.0001 < *y) {
      dVar8 = ((*b + -1.0) * *x) / *y - *a;
      if (dVar8 < 1.0) goto LAB_0010674b;
      if (dVar8 < (double)iVar1) {
        iVar2 = (int)dVar8;
      }
    }
    iVar3 = 0;
    if (0 < iVar2) {
      iVar3 = iVar2;
    }
    iVar4 = 1;
    while (bVar5 = iVar3 != 0, iVar3 = iVar3 + -1, bVar5) {
      bup::d = bup::d * ((bup::apb + (double)(iVar4 + -1)) / ((double)(iVar4 + -1) + bup::ap1)) * *x
      ;
      dVar7 = dVar7 + bup::d;
      iVar4 = iVar4 + 1;
    }
    if (iVar2 == iVar1) goto LAB_00106807;
  }
  do {
    if (iVar1 <= iVar2) break;
    dVar8 = (double)iVar2;
    iVar2 = iVar2 + 1;
    bup::d = bup::d * ((bup::apb + dVar8) / (dVar8 + bup::ap1)) * *x;
    dVar7 = dVar7 + bup::d;
  } while (*eps * dVar7 < bup::d);
LAB_00106807:
  return dVar6 * dVar7;
}

Assistant:

double bup(double *a,double *b,double *x,double *y,int *n,double *eps)
/*
-----------------------------------------------------------------------
     EVALUATION OF IX(A,B) - IX(A+N,B) WHERE N IS A POSITIVE INTEGER.
     EPS IS THE TOLERANCE USED.
-----------------------------------------------------------------------
*/
{
static int K1 = 1;
static int K2 = 0;
static double bup,ap1,apb,d,l,r,t,w;
static int i,k,kp1,mu,nm1;
/*
     ..
     .. Executable Statements ..
*/
/*
          OBTAIN THE SCALING FACTOR EXP(-MU) AND
             EXP(MU)*(X**A*Y**B/BETA(A,B))/A
*/
    apb = *a+*b;
    ap1 = *a+1.0e0;
    mu = 0;
    d = 1.0e0;
    if(*n == 1 || *a < 1.0e0) goto S10;
    if(apb < 1.1e0*ap1) goto S10;
    mu = fabs(exparg(&K1));
    k = exparg(&K2);
    if(k < mu) mu = k;
    t = mu;
    d = exp(-t);
S10:
    bup = brcmp1(&mu,a,b,x,y)/ *a;
    if(*n == 1 || bup == 0.0e0) return bup;
    nm1 = *n-1;
    w = d;
/*
          LET K BE THE INDEX OF THE MAXIMUM TERM
*/
    k = 0;
    if(*b <= 1.0e0) goto S50;
    if(*y > 1.e-4) goto S20;
    k = nm1;
    goto S30;
S20:
    r = (*b-1.0e0)**x/ *y-*a;
    if(r < 1.0e0) goto S50;
    k = t = nm1;
    if(r < t) k = r;
S30:
/*
          ADD THE INCREASING TERMS OF THE SERIES
*/
    for(i=1; i<=k; i++) {
        l = i-1;
        d = (apb+l)/(ap1+l)**x*d;
        w += d;
    }
    if(k == nm1) goto S70;
S50:
/*
          ADD THE REMAINING TERMS OF THE SERIES
*/
    kp1 = k+1;
    for(i=kp1; i<=nm1; i++) {
        l = i-1;
        d = (apb+l)/(ap1+l)**x*d;
        w += d;
        if(d <= *eps*w) goto S70;
    }
S70:
/*
               TERMINATE THE PROCEDURE
*/
    bup *= w;
    return bup;
}